

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap.h
# Opt level: O0

void __thiscall
Gluco::Heap<Gluco::SimpSolver::ElimLt>::clear(Heap<Gluco::SimpSolver::ElimLt> *this,bool dealloc)

{
  int iVar1;
  int *piVar2;
  int local_18;
  int i;
  bool dealloc_local;
  Heap<Gluco::SimpSolver::ElimLt> *this_local;
  
  local_18 = 0;
  while( true ) {
    iVar1 = vec<int>::size(&this->heap);
    if (iVar1 <= local_18) break;
    piVar2 = vec<int>::operator[](&this->heap,local_18);
    piVar2 = vec<int>::operator[](&this->indices,*piVar2);
    *piVar2 = -1;
    local_18 = local_18 + 1;
  }
  vec<int>::clear(&this->heap,dealloc);
  return;
}

Assistant:

void clear(bool dealloc = false) 
    { 
        int i;
        for (i = 0; i < heap.size(); i++)
            indices[heap[i]] = -1;
        heap.clear(dealloc); 
    }